

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_torrent.cpp
# Opt level: O2

entry * __thiscall
libtorrent::create_torrent::generate(entry *__return_storage_ptr__,create_torrent *this)

{
  vector<aux::vector<sha256_hash,_piece_index_t::diff_type>,_file_index_t> *file_piece_hash;
  uint *puVar1;
  file_flags_t fVar2;
  int iVar3;
  pointer ppVar4;
  pointer pbVar5;
  pointer pcVar6;
  pointer pcVar7;
  pointer pcVar8;
  libtorrent *this_00;
  pointer pdVar9;
  pointer pdVar10;
  integer_type iVar11;
  size_holder<true,_unsigned_long,_void> sVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  byte bVar16;
  data_type dVar17;
  entry *peVar18;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar19;
  map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void> *this_01;
  mapped_type *this_02;
  string_type *psVar20;
  entry *this_03;
  list_type *plVar21;
  entry *peVar22;
  pointer pcVar23;
  entry *peVar24;
  key_type *k;
  dictionary_type *pdVar25;
  create_torrent *pcVar26;
  char *pcVar27;
  char *pcVar28;
  const_iterator __begin2;
  pointer ppVar29;
  int iVar30;
  sha256_hash *in_R8;
  const_iterator __end2;
  pointer pdVar31;
  ulong uVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *url_1;
  pointer pbVar33;
  long lVar34;
  pointer pdVar35;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view key_12;
  string_view key_13;
  string_view key_14;
  string_view key_15;
  string_view key_16;
  string_view key_17;
  string_view key_18;
  span<const_char> str;
  string_view key_19;
  string_view key_20;
  string_view key_21;
  span<const_char> str_00;
  string_view key_22;
  string_view key_23;
  string_view key_24;
  string_view key_25;
  span<const_char> str_01;
  string_view key_26;
  string_view key_27;
  string_view key_28;
  string_view key_29;
  span<const_libtorrent::digest32<256L>_> leaves;
  string_view p;
  string_view p_00;
  string_view p_01;
  string_view p_02;
  string_view p_03;
  string_view p_04;
  list_type node;
  list_type tier;
  undefined8 uStack_230;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  e;
  vector<sha256_hash,_file_index_t> fileroots;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_1d0;
  tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
  local_1b0;
  string local_188;
  string_type local_168;
  string_type local_148;
  string_type local_128;
  string_type local_108;
  string_type local_e8;
  string_type local_c8;
  string local_a8;
  string local_88;
  string_type local_68;
  _Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> local_48;
  
  if (((this->m_files).
       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->m_files).
       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>.
       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (this->m_total_size == 0)) {
    node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(node.
                           super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0xd3);
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)&node);
  }
  file_piece_hash = &this->m_file_piece_hash;
  bVar13 = anon_unknown_40::validate_v2_hashes(&this->m_files,file_piece_hash,this->m_piece_length);
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::vector
            ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
             &local_48,
             &(this->m_piece_hash).
              super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            );
  bVar14 = anon_unknown_40::validate_v1_hashes
                     ((vector<sha1_hash,_piece_index_t> *)&local_48,this->m_total_size,
                      this->m_piece_length);
  ::std::_Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
  ~_Vector_base(&local_48);
  if (!bVar13 && !bVar14) {
    node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(node.
                           super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,0xaf);
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)&node);
  }
  entry::entry(__return_storage_ptr__);
  ppVar29 = (this->m_urls).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar29 !=
      (this->m_urls).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::string((string *)&local_c8,(string *)ppVar29);
    key._M_str = "announce";
    key._M_len = 8;
    peVar18 = entry::operator[](__return_storage_ptr__,key);
    entry::operator=(peVar18,&local_c8);
    ::std::__cxx11::string::~string((string *)&local_c8);
  }
  if ((this->m_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->m_nodes).
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_00._M_str = "nodes";
    key_00._M_len = 5;
    peVar18 = entry::operator[](__return_storage_ptr__,key_00);
    pvVar19 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar18);
    ppVar4 = (this->m_nodes).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar29 = (this->m_nodes).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar29 != ppVar4;
        ppVar29 = ppVar29 + 1) {
      ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
                (&node,2,(allocator_type *)&tier);
      ::std::__cxx11::string::string((string *)&local_68,(string *)ppVar29);
      entry::operator=(node.
                       super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                       _M_impl.super__Vector_impl_data._M_start,&local_68);
      ::std::__cxx11::string::~string((string *)&local_68);
      entry::operator=(node.
                       super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                       _M_impl.super__Vector_impl_data._M_start + 1,(long)ppVar29->second);
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>(pvVar19,&node);
      ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector(&node);
    }
  }
  ppVar29 = (this->m_urls).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (this->m_urls).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (1 < (ulong)(((long)ppVar4 - (long)ppVar29) / 0x28)) {
    node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar30 = ppVar29->second;
    for (; ppVar29 != ppVar4; ppVar29 = ppVar29 + 1) {
      iVar3 = ppVar29->second;
      if (iVar3 != iVar30) {
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                  ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)&node,
                   (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&tier);
        ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::clear
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&tier);
        iVar30 = iVar3;
      }
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)&tier,
                 &ppVar29->first);
    }
    ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
              ((vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)&node,&tier);
    local_1b0.
    super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
    .m_icont.
    super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
    .holder.root.super_node.parent_ =
         (node_ptr)
         node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_1b0.
    super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
    .m_icont.
    super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
    .holder.root.super_node.left_ =
         (node_ptr)
         node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_1b0.
    super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
    .m_icont.
    super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
    .
    super_bstbase3<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_(boost::intrusive::algo_types)5,_void>
    .holder.root.super_node.right_ =
         (node_ptr)
         node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    key_01._M_str = "announce-list";
    key_01._M_len = 0xd;
    peVar18 = entry::operator[](__return_storage_ptr__,key_01);
    entry::operator=(peVar18,(list_type *)
                             ((long)&local_1b0.
                                     super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                                     .m_icont.
                                     super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                                     .
                                     super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                                     .
                                     super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                             + 8));
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
               ((long)&local_1b0.
                       super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                       .m_icont.
                       super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                       .
                       super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
               + 8));
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector(&tier);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector(&node);
  }
  if ((this->m_comment)._M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&local_e8,(string *)&this->m_comment);
    key_02._M_str = "comment";
    key_02._M_len = 7;
    peVar18 = entry::operator[](__return_storage_ptr__,key_02);
    entry::operator=(peVar18,&local_e8);
    ::std::__cxx11::string::~string((string *)&local_e8);
  }
  lVar34 = this->m_creation_date;
  if (lVar34 != 0) {
    key_03._M_str = "creation date";
    key_03._M_len = 0xd;
    peVar18 = entry::operator[](__return_storage_ptr__,key_03);
    entry::operator=(peVar18,lVar34);
  }
  if ((this->m_created_by)._M_string_length != 0) {
    ::std::__cxx11::string::string((string *)&local_108,(string *)&this->m_created_by);
    key_04._M_str = "created by";
    key_04._M_len = 10;
    peVar18 = entry::operator[](__return_storage_ptr__,key_04);
    entry::operator=(peVar18,&local_108);
    ::std::__cxx11::string::~string((string *)&local_108);
  }
  pbVar33 = (this->m_url_seeds).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this->m_url_seeds).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar33 != pbVar5) {
    if ((long)pbVar5 - (long)pbVar33 == 0x20) {
      ::std::__cxx11::string::string((string *)&local_128,(string *)pbVar33);
      key_05._M_str = "url-list";
      key_05._M_len = 8;
      peVar18 = entry::operator[](__return_storage_ptr__,key_05);
      entry::operator=(peVar18,&local_128);
      ::std::__cxx11::string::~string((string *)&local_128);
    }
    else {
      key_08._M_str = "url-list";
      key_08._M_len = 8;
      peVar18 = entry::operator[](__return_storage_ptr__,key_08);
      pbVar5 = (this->m_url_seeds).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar33 = (this->m_url_seeds).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar33 != pbVar5;
          pbVar33 = pbVar33 + 1) {
        pvVar19 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list(peVar18);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>(pvVar19,pbVar33);
      }
    }
  }
  fileroots.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fileroots.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fileroots.super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (bVar13) {
    ::std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::resize
              (&fileroots.
                super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ,((long)(this->m_files).
                       super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       .
                       super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x58);
    merkle_pad((sha256_hash *)&node,this->m_piece_length / 0x4000,1);
    key_06._M_str = "piece layers";
    key_06._M_len = 0xc;
    peVar18 = entry::operator[](__return_storage_ptr__,key_06);
    this_01 = (map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void> *
              )entry::dict_abi_cxx11_(peVar18);
    pcVar6 = (this->m_files).
             super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
             .
             super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar7 = (this->m_files).
             super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
             .
             super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (uVar32 = 0; uVar32 != (((long)pcVar6 - (long)pcVar7) / 0x58 & 0xffffffffU);
        uVar32 = uVar32 + 1) {
      pcVar23 = (this->m_files).
                super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                .
                super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((((file_flags_t *)((long)(pcVar23 + uVar32) + 0x28))->m_val & 1) == 0) &&
         (*(int64_t *)((long)(pcVar23 + uVar32) + 0x20) != 0)) {
        pcVar8 = (file_piece_hash->
                 super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                 ).
                 super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        this_00 = *(libtorrent **)
                   &pcVar8[uVar32].
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ;
        leaves.m_ptr = (digest32<256L> *)
                       ((long)*(pointer *)
                               ((long)&pcVar8[uVar32].
                                       super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                       .
                                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                               + 8) - (long)this_00 >> 5);
        leaves.m_len = (difference_type)&node;
        merkle_root((sha256_hash *)&tier,this_00,leaves,in_R8);
        puVar1 = fileroots.
                 super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar32].m_number._M_elems + 4;
        *(pointer *)puVar1 =
             tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        *(undefined8 *)(puVar1 + 2) = uStack_230;
        *(pointer *)
         fileroots.
         super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar32].m_number._M_elems =
             tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
             super__Vector_impl_data._M_start;
        *(pointer *)
         (fileroots.
          super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar32].m_number._M_elems + 2) =
             tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pcVar8 = (file_piece_hash->
                 super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                 ).
                 super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (0x20 < (ulong)((long)*(pointer *)
                                  ((long)&pcVar8[uVar32].
                                          super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                          .
                                          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                  + 8) -
                          *(long *)&pcVar8[uVar32].
                                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    .
                                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          )) {
          digest32<256l>::to_string_abi_cxx11_
                    ((string *)&tier,
                     fileroots.
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar32);
          this_02 = boost::container::
                    map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>
                    ::priv_subscript<std::__cxx11::string>(this_01,(string *)&tier);
          psVar20 = entry::string_abi_cxx11_(this_02);
          ::std::__cxx11::string::~string((string *)&tier);
          psVar20->_M_string_length = 0;
          *(psVar20->_M_dataplus)._M_p = '\0';
          ::std::__cxx11::string::reserve((ulong)psVar20);
          pcVar8 = (file_piece_hash->
                   super_vector<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ).
                   super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::digest32<256L>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::difference_tag<libtorrent::aux::piece_index_tag>,_void>,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar9 = *(pointer *)
                    ((long)&pcVar8[uVar32].
                            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                            .
                            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    + 8);
          for (pdVar31 = *(pointer *)
                          &pcVar8[uVar32].
                           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           .
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
              ; pdVar31 != pdVar9; pdVar31 = pdVar31 + 1) {
            ::std::__cxx11::string::append((char *)psVar20,(ulong)pdVar31);
          }
        }
      }
    }
  }
  key_07._M_str = "info";
  key_07._M_len = 4;
  this_03 = entry::operator[](__return_storage_ptr__,key_07);
  peVar18 = &this->m_info_dict;
  dVar17 = entry::type(peVar18);
  if ((dVar17 == dictionary_t) || (dVar17 = entry::type(peVar18), dVar17 == preformatted_t)) {
    entry::operator=(this_03,peVar18);
  }
  else {
    if ((this->m_collections).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_collections).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      key_09._M_str = "collections";
      key_09._M_len = 0xb;
      peVar18 = entry::operator[](this_03,key_09);
      pbVar5 = (this->m_collections).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar33 = (this->m_collections).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar33 != pbVar5;
          pbVar33 = pbVar33 + 1) {
        pvVar19 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list(peVar18);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<std::__cxx11::string_const&>(pvVar19,pbVar33);
      }
    }
    if ((this->m_similar).
        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->m_similar).
        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      key_10._M_str = "similar";
      key_10._M_len = 7;
      peVar18 = entry::operator[](this_03,key_10);
      pdVar10 = (this->m_similar).
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pdVar35 = (this->m_similar).
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pdVar35 != pdVar10;
          pdVar35 = pdVar35 + 1) {
        pvVar19 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                  entry::list(peVar18);
        ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
        emplace_back<libtorrent::digest32<160l>const&>(pvVar19,pdVar35);
      }
    }
    ::std::__cxx11::string::string((string *)&local_148,(string *)&this->m_name);
    key_11._M_str = "name";
    key_11._M_len = 4;
    peVar18 = entry::operator[](this_03,key_11);
    entry::operator=(peVar18,&local_148);
    ::std::__cxx11::string::~string((string *)&local_148);
    if ((this->m_root_cert)._M_string_length != 0) {
      ::std::__cxx11::string::string((string *)&local_168,(string *)&this->m_root_cert);
      key_12._M_str = "ssl-cert";
      key_12._M_len = 8;
      peVar18 = entry::operator[](this_03,key_12);
      entry::operator=(peVar18,&local_168);
      ::std::__cxx11::string::~string((string *)&local_168);
    }
    if ((this->field_0x258 & 2) != 0) {
      key_13._M_str = "private";
      key_13._M_len = 7;
      peVar18 = entry::operator[](this_03,key_13);
      entry::operator=(peVar18,1);
    }
    if (bVar14) {
      if ((this->field_0x258 & 1) == 0) {
        pcVar6 = (this->m_files).
                 super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                 .
                 super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((this->field_0x258 & 4) != 0) && (lVar34 = pcVar6->mtime, lVar34 != 0)) {
          key_19._M_str = "mtime";
          key_19._M_len = 5;
          peVar18 = entry::operator[](this_03,key_19);
          entry::operator=(peVar18,lVar34);
        }
        iVar11 = pcVar6->size;
        key_20._M_str = "length";
        key_20._M_len = 6;
        peVar18 = entry::operator[](this_03,key_20);
        entry::operator=(peVar18,iVar11);
        fVar2.m_val = (pcVar6->flags).m_val;
        anon_unknown_40::add_file_attrs(this_03,fVar2,(bool)((this->field_0x258 & 8) >> 3));
        if ((fVar2.m_val & this->field_0x258 & 8) == 8) {
          ::std::__cxx11::string::string((string *)&local_188,(string *)&pcVar6->symlink);
          anon_unknown_40::add_symlink_path(this_03,&local_188);
          ::std::__cxx11::string::~string((string *)&local_188);
        }
        pdVar35 = (this->m_filehashes).
                  super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                  .
                  super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pdVar35 !=
            (this->m_filehashes).
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          key_21._M_str = "sha1";
          key_21._M_len = 4;
          peVar18 = entry::operator[](this_03,key_21);
          str_00.m_len = 0x14;
          str_00.m_ptr = (char *)pdVar35;
          entry::operator=(peVar18,str_00);
        }
      }
      else {
        key_14._M_str = "files";
        key_14._M_len = 5;
        peVar18 = entry::operator[](this_03,key_14);
        pcVar6 = (this->m_files).
                 super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                 .
                 super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar7 = (this->m_files).
                 super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                 .
                 super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar26 = (create_torrent *)0x58;
        for (uVar32 = 0; uVar32 != (((long)pcVar6 - (long)pcVar7) / 0x58 & 0xffffffffU);
            uVar32 = uVar32 + 1) {
          plVar21 = entry::list(peVar18);
          ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::emplace_back<>
                    (plVar21);
          plVar21 = entry::list(peVar18);
          peVar24 = (plVar21->
                    super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>).
                    _M_impl.super__Vector_impl_data._M_finish + -1;
          pcVar23 = (this->m_files).
                    super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    .
                    super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((this->field_0x258 & 4) != 0) {
            pcVar26 = (create_torrent *)(uVar32 * 0x58);
            lVar34 = *(long *)((long)&(pcVar26->m_name)._M_string_length + (long)pcVar23);
            if (lVar34 != 0) {
              key_15._M_str = "mtime";
              key_15._M_len = 5;
              peVar22 = entry::operator[](peVar24,key_15);
              entry::operator=(peVar22,lVar34);
              pcVar23 = (this->m_files).
                        super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        .
                        super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
          }
          iVar11 = *(int64_t *)((long)(pcVar23 + uVar32) + 0x20);
          key_16._M_str = "length";
          key_16._M_len = 6;
          peVar22 = entry::operator[](peVar24,key_16);
          entry::operator=(peVar22,iVar11);
          key_17._M_str = "path";
          key_17._M_len = 4;
          peVar22 = entry::operator[](peVar24,key_17);
          ::std::__cxx11::string::string
                    ((string *)&node,
                     (string *)
                     ((this->m_files).
                      super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      .
                      super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar32));
          p._M_str = (char *)pcVar26;
          p._M_len = (size_t)node.
                             super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                             ._M_impl.super__Vector_impl_data._M_start;
          lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)&tier,(libtorrent *)
                               node.
                               super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                               ._M_impl.super__Vector_impl_data._M_finish,p);
          p_00._M_str = (char *)pcVar26;
          p_00._M_len = uStack_230;
          lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                       *)&tier,(libtorrent *)
                               tier.
                               super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,p_00);
          while (tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                 _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            pvVar19 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                      entry::list(peVar22);
            ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
            emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                      (pvVar19,(basic_string_view<char,_std::char_traits<char>_> *)&tier);
            p_01._M_str = (char *)pcVar26;
            p_01._M_len = uStack_230;
            lsplit_path(&e,(libtorrent *)
                           tier.
                           super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,p_01);
            tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)e.first._M_str;
            tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)e.second._M_len;
            uStack_230 = e.second._M_str;
            tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)e.first._M_len;
          }
          ::std::__cxx11::string::~string((string *)&node);
          fVar2.m_val = ((file_flags_t *)
                        ((long)((this->m_files).
                                super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                .
                                super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar32) + 0x28))->m_val;
          pcVar26 = this;
          anon_unknown_40::add_file_attrs(peVar24,fVar2,(bool)((this->field_0x258 & 8) >> 3));
          if (((this->field_0x258 & 8) != 0) && ((fVar2.m_val & 8) != 0)) {
            ::std::__cxx11::string::string
                      ((string *)&local_88,
                       (string *)
                       ((long)((this->m_files).
                               super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                               .
                               super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar32) + 0x38));
            anon_unknown_40::add_symlink_path(peVar24,&local_88);
            ::std::__cxx11::string::~string((string *)&local_88);
          }
          pdVar35 = (this->m_filehashes).
                    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (pdVar35 !=
              (this->m_filehashes).
              super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
              .
              super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            digest32<160L>::clear((digest32<160L> *)&node);
            bVar15 = digest32<160L>::operator!=(pdVar35 + uVar32,(digest32<160L> *)&node);
            if (bVar15) {
              pdVar35 = (this->m_filehashes).
                        super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                        .
                        super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              key_18._M_str = "sha1";
              key_18._M_len = 4;
              peVar24 = entry::operator[](peVar24,key_18);
              str.m_len = 0x14;
              str.m_ptr = (char *)(pdVar35 + uVar32);
              entry::operator=(peVar24,str);
            }
          }
        }
      }
    }
    if (bVar13) {
      key_22._M_str = "file tree";
      key_22._M_len = 9;
      peVar18 = entry::operator[](this_03,key_22);
      pcVar6 = (this->m_files).
               super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
               .
               super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pcVar7 = (this->m_files).
               super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
               .
               super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pcVar28 = (char *)0x0;
          pcVar28 != (char *)(((long)pcVar6 - (long)pcVar7) / 0x58 & 0xffffffffU);
          pcVar28 = pcVar28 + 1) {
        pcVar23 = (this->m_files).
                  super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  .
                  super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        fVar2.m_val = ((file_flags_t *)((long)(pcVar23 + (long)pcVar28) + 0x28))->m_val;
        if ((fVar2.m_val & 1) == 0) {
          pcVar27 = pcVar28;
          ::std::__cxx11::string::string((string *)&node,(string *)(pcVar23 + (long)pcVar28));
          if ((this->field_0x258 & 1) == 0) {
            tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
            super__Vector_impl_data._M_start =
                 node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            tier.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            uStack_230 = node.
                         super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                         _M_impl.super__Vector_impl_data._M_start;
          }
          else {
            p_02._M_str = pcVar27;
            p_02._M_len = (size_t)node.
                                  super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
            lsplit_path((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                         *)&tier,(libtorrent *)
                                 node.
                                 super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,p_02);
          }
          p_03._M_str = pcVar27;
          p_03._M_len = uStack_230;
          lsplit_path(&e,(libtorrent *)
                         tier.
                         super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,p_03);
          peVar24 = peVar18;
          while (e.first._M_len != 0) {
            key_23._M_str = e.first._M_str;
            key_23._M_len = e.first._M_len;
            peVar24 = entry::operator[](peVar24,key_23);
            k = (key_type *)entry::dict_abi_cxx11_(peVar24);
            local_1d0.first._M_str = (char *)0x0;
            local_1d0.second._M_len._0_1_ = 0;
            local_1d0.first._M_len = (size_t)&local_1d0.second;
            boost::container::dtl::
            tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
            ::find(&local_1b0,k);
            pdVar25 = entry::dict_abi_cxx11_(peVar24);
            sVar12.size_ = local_1b0.
                           super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                           .m_icont.
                           super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                           .
                           super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                           .
                           super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                           .super_size_holder<true,_unsigned_long,_void>.size_;
            ::std::__cxx11::string::~string((string *)&local_1d0);
            if ((bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
                 *)sVar12.size_ !=
                &(pdVar25->
                 super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                 ).
                 super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                 .m_icont.
                 super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                 .
                 super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                 .
                 super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                 .
                 super_bstbase2<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_(boost::intrusive::algo_types)5,_void>
               ) {
              local_1d0.first._M_len = CONCAT44(local_1d0.first._M_len._4_4_,0xd5);
              aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                        ((error_code_enum *)&local_1d0);
            }
            p_04._M_str = pcVar27;
            p_04._M_len = (size_t)e.second._M_str;
            lsplit_path(&local_1d0,(libtorrent *)e.second._M_len,p_04);
            e.first._M_str = local_1d0.first._M_str;
            e.second._M_len =
                 CONCAT71(local_1d0.second._M_len._1_7_,(undefined1)local_1d0.second._M_len);
            e.second._M_str = local_1d0.second._M_str;
            e.first._M_len = local_1d0.first._M_len;
          }
          ::std::__cxx11::string::~string((string *)&node);
          pdVar25 = entry::dict_abi_cxx11_(peVar24);
          if (*(long *)&(pdVar25->
                        super_tree<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_int,_libtorrent::aux::strview_less,_void,_void>
                        ).
                        super_node_alloc_holder<boost::container::new_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_>,_boost::intrusive::rbtree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_void>_>
                        .m_icont.
                        super_bstree_impl<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_unsigned_long,_true,_(boost::intrusive::algo_types)5,_void>
                        .
                        super_bstbase<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                        .
                        super_bstbase_hack<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_void,_boost::container::value_to_node_compare<boost::container::dtl::tree_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::tree_value_compare<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry>_*,_libtorrent::aux::strview_less,_boost::container::dtl::select1st<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool,_false>,_bool>,_true,_unsigned_long,_(boost::intrusive::algo_types)5,_void>
                        .super_size_holder<true,_unsigned_long,_void> != 0) {
            node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(node.
                                   super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,0xd5);
            aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                      ((error_code_enum *)&node);
          }
          peVar24 = entry::operator[](peVar24,(string_view)ZEXT816(0));
          bVar16 = this->field_0x258;
          if (((bVar16 & 4) != 0) &&
             (lVar34 = *(time_t *)
                        ((long)((this->m_files).
                                super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                .
                                super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)pcVar28) + 0x30),
             lVar34 != 0)) {
            key_24._M_str = "mtime";
            key_24._M_len = 5;
            peVar22 = entry::operator[](peVar24,key_24);
            entry::operator=(peVar22,lVar34);
            bVar16 = this->field_0x258;
          }
          anon_unknown_40::add_file_attrs(peVar24,fVar2,(bool)((bVar16 & 8) >> 3));
          pdVar31 = fileroots.
                    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pcVar23 = (this->m_files).
                    super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    .
                    super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if ((fVar2.m_val & this->field_0x258 & 8) == 0) {
            lVar34 = *(int64_t *)((long)(pcVar23 + (long)pcVar28) + 0x20);
            if (0 < lVar34) {
              key_25._M_str = "pieces root";
              key_25._M_len = 0xb;
              peVar22 = entry::operator[](peVar24,key_25);
              str_01.m_len = 0x20;
              str_01.m_ptr = (char *)(pdVar31 + (long)pcVar28);
              entry::operator=(peVar22,str_01);
              lVar34 = *(int64_t *)
                        ((long)((this->m_files).
                                super_vector<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                .
                                super__Vector_base<libtorrent::create_file_entry,_std::allocator<libtorrent::create_file_entry>_>
                                ._M_impl.super__Vector_impl_data._M_start + (long)pcVar28) + 0x20);
            }
            key_26._M_str = "length";
            key_26._M_len = 6;
            peVar24 = entry::operator[](peVar24,key_26);
            entry::operator=(peVar24,lVar34);
          }
          else {
            ::std::__cxx11::string::string
                      ((string *)&local_a8,(string *)((long)(pcVar23 + (long)pcVar28) + 0x38));
            anon_unknown_40::add_symlink_path(peVar24,&local_a8);
            ::std::__cxx11::string::~string((string *)&local_a8);
          }
        }
      }
      key_27._M_str = "meta version";
      key_27._M_len = 0xc;
      peVar18 = entry::operator[](this_03,key_27);
      entry::operator=(peVar18,2);
    }
    iVar30 = this->m_piece_length;
    key_28._M_str = "piece length";
    key_28._M_len = 0xc;
    peVar18 = entry::operator[](this_03,key_28);
    entry::operator=(peVar18,(long)iVar30);
    if (bVar14) {
      key_29._M_str = "pieces";
      key_29._M_len = 6;
      peVar18 = entry::operator[](this_03,key_29);
      psVar20 = entry::string_abi_cxx11_(peVar18);
      pdVar10 = (this->m_piece_hash).
                super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                .
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pdVar35 = (this->m_piece_hash).
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pdVar35 != pdVar10;
          pdVar35 = pdVar35 + 1) {
        ::std::__cxx11::string::append((char *)psVar20,(ulong)pdVar35);
      }
    }
  }
  ::std::_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
  ~_Vector_base((_Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 *)&fileroots);
  return __return_storage_ptr__;
}

Assistant:

entry create_torrent::generate() const
	{
		if (m_files.empty() || m_total_size == 0)
			aux::throw_ex<system_error>(errors::torrent_missing_file_tree);

		// if all v2 hashes are set correctly, generate the v2 parts of the
		// torrent
		bool const make_v2 = validate_v2_hashes(m_files, m_file_piece_hash, m_piece_length);
		bool const make_v1 = validate_v1_hashes(m_piece_hash, m_total_size, m_piece_length);

		// if neither v1 nor v2 hashes were set, we can't create a torrent
		if (!make_v1 && !make_v2)
			aux::throw_ex<system_error>(errors::invalid_hash_entry);

		TORRENT_ASSERT(m_piece_length > 0);

		entry dict;

		if (!m_urls.empty()) dict["announce"] = m_urls.front().first;

		if (!m_nodes.empty())
		{
			entry& nodes = dict["nodes"];
			entry::list_type& nodes_list = nodes.list();
			for (auto const& n : m_nodes)
			{
				entry::list_type node(2);
				node[0] = n.first;
				node[1] = n.second;
				nodes_list.emplace_back(std::move(node));
			}
		}

		if (m_urls.size() > 1)
		{
			entry::list_type trackers;
			entry::list_type tier;
			int current_tier = m_urls.front().second;
			for (auto const& url : m_urls)
			{
				if (url.second != current_tier)
				{
					current_tier = url.second;
					trackers.emplace_back(std::move(tier));
					tier.clear();
				}
				tier.emplace_back(url.first);
			}
			trackers.emplace_back(std::move(tier));
			dict["announce-list"] = std::move(trackers);
		}

		if (!m_comment.empty())
			dict["comment"] = m_comment;

		if (m_creation_date != 0)
			dict["creation date"] = m_creation_date;

		if (!m_created_by.empty())
			dict["created by"] = m_created_by;

		if (!m_url_seeds.empty())
		{
			if (m_url_seeds.size() == 1)
			{
				dict["url-list"] = m_url_seeds.front();
			}
			else
			{
				entry& list = dict["url-list"];
				for (auto const& url : m_url_seeds)
				{
					list.list().emplace_back(url);
				}
			}
		}

		aux::vector<sha256_hash, file_index_t> fileroots;
		if (make_v2)
		{
			TORRENT_ASSERT(!m_file_piece_hash.empty());
			fileroots.resize(m_files.size());

			sha256_hash const pad_hash = merkle_pad(m_piece_length / default_block_size, 1);
			auto& file_pieces = dict["piece layers"].dict();

			for (file_index_t fi : file_range())
			{
				if (m_files[fi].flags & file_storage::flag_pad_file) continue;
				if (m_files[fi].size == 0) continue;

				fileroots[fi] = merkle_root(m_file_piece_hash[fi], pad_hash);

				// files that only have one piece store the piece hash as the
				// root, we don't need a pieces layer entry for such files
				if (m_file_piece_hash[fi].size() < 2) continue;
				auto& pieces = file_pieces[fileroots[fi].to_string()].string();
				pieces.clear();
				pieces.reserve(m_file_piece_hash[fi].size() * sha256_hash::size());
				for (auto const& p : m_file_piece_hash[fi])
					pieces.append(reinterpret_cast<const char*>(p.data()), p.size());
			}
		}

		entry& info = dict["info"];
#if TORRENT_ABI_VERSION < 4
		if (m_info_dict.type() == entry::dictionary_t
			|| m_info_dict.type() == entry::preformatted_t)
		{
			info = m_info_dict;
			return dict;
		}
#endif

		if (!m_collections.empty())
		{
			entry& list = info["collections"];
			for (auto const& c : m_collections)
			{
				list.list().emplace_back(c);
			}
		}

		if (!m_similar.empty())
		{
			entry& list = info["similar"];
			for (auto const& ih : m_similar)
			{
				list.list().emplace_back(ih);
			}
		}

		info["name"] = m_name;

		if (!m_root_cert.empty())
			info["ssl-cert"] = m_root_cert;

		if (m_private) info["private"] = 1;

		if (make_v1)
		{
			if (!m_multifile)
			{
				auto const& file = m_files.front();
				if (m_include_mtime && file.mtime)
					info["mtime"] = file.mtime;
				info["length"] = file.size;
				file_flags_t const flags = file.flags;
				add_file_attrs(info, flags, m_include_symlinks);
				if (m_include_symlinks
					&& (flags & file_storage::flag_symlink))
				{
					add_symlink_path(info, file.symlink);
				}
#if TORRENT_ABI_VERSION < 3
				if (!m_filehashes.empty())
				{
					info["sha1"] = m_filehashes.front();
				}
#endif
			}
			else
			{
				entry& files = info["files"];

				for (auto const i : file_range())
				{
					files.list().emplace_back();
					entry& file_e = files.list().back();
					if (m_include_mtime && m_files[i].mtime) file_e["mtime"] = m_files[i].mtime;
					file_e["length"] = m_files[i].size;

					TORRENT_ASSERT(has_parent_path(m_files[i].filename));

					{
						entry& path_e = file_e["path"];

						std::string const p = m_files[i].filename;
						// deliberately skip the first path element, since that's the
						// "name" of the torrent already
						string_view path = lsplit_path(p).second;
						for (auto elems = lsplit_path(path); !elems.first.empty(); elems = lsplit_path(elems.second))
							path_e.list().emplace_back(elems.first);
					}

					file_flags_t const flags = m_files[i].flags;
					add_file_attrs(file_e, flags, m_include_symlinks);

					if (m_include_symlinks && (flags & file_storage::flag_symlink))
					{
						add_symlink_path(file_e, m_files[i].symlink);
					}
#if TORRENT_ABI_VERSION < 3
					if (!m_filehashes.empty() && m_filehashes[i] != sha1_hash())
					{
						file_e["sha1"] = m_filehashes[i];
					}
#endif
				}
			}
		}

		if (make_v2)
		{
			auto& tree = info["file tree"];

			for (file_index_t i : file_range())
			{
				file_flags_t const flags = m_files[i].flags;
				if (flags & file_storage::flag_pad_file) continue;

				entry* file_e_ptr = &tree;

				{
					std::string const file_path = m_files[i].filename;
					auto const split = m_multifile
						? lsplit_path(file_path)
						: std::pair<string_view, string_view>(file_path, file_path);
					TORRENT_ASSERT(split.first == m_name);

					for (auto e = lsplit_path(split.second);
						!e.first.empty();
						e = lsplit_path(e.second))
					{
						file_e_ptr = &(*file_e_ptr)[e.first];
						if (file_e_ptr->dict().find({}) != file_e_ptr->dict().end())
						{
							// path conflict
							// there is already a file with this name
							// refuse to generate a torrent with such a conflict
							aux::throw_ex<system_error>(errors::torrent_inconsistent_files);
						}
					}
				}

				if (!file_e_ptr->dict().empty())
				{
					// path conflict
					// there is already a directory with this name
					// refuse to generate a torrent with such a conflict
					aux::throw_ex<system_error>(errors::torrent_inconsistent_files);
				}

				entry& file_e = (*file_e_ptr)[{}];

				if (m_include_mtime && m_files[i].mtime) file_e["mtime"] = m_files[i].mtime;

				add_file_attrs(file_e, flags, m_include_symlinks);

				if (m_include_symlinks && (flags & file_storage::flag_symlink))
				{
					add_symlink_path(file_e, m_files[i].symlink);
				}
				else
				{
					if (m_files[i].size > 0)
						file_e["pieces root"] = fileroots[i];
					file_e["length"] = m_files[i].size;
				}
			}
			info["meta version"] = 2;
		}

		info["piece length"] = m_piece_length;

		if (make_v1)
		{
			std::string& p = info["pieces"].string();

			for (sha1_hash const& h : m_piece_hash)
				p.append(h.data(), h.size());
		}

		return dict;
	}